

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O0

PDFObject * __thiscall PDFObjectParser::ParseLiteralString(PDFObjectParser *this,string *inToken)

{
  bool bVar1;
  char *pcVar2;
  Trace *this_00;
  undefined8 uVar3;
  long lVar4;
  reference pcVar5;
  ulong uVar6;
  ulong uVar7;
  string local_138;
  string local_118;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  undefined4 local_d4;
  string local_d0 [48];
  ulong local_a0;
  size_t i;
  const_iterator it;
  stringbuf local_88 [7];
  Byte buffer;
  stringbuf stringBuffer;
  string *inToken_local;
  PDFObjectParser *this_local;
  
  std::__cxx11::stringbuf::stringbuf(local_88);
  i = std::__cxx11::string::begin();
  local_a0 = 1;
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&i);
  std::__cxx11::string::size();
  pcVar2 = (char *)std::__cxx11::string::at((ulong)inToken);
  if (*pcVar2 == ')') {
    for (; uVar6 = local_a0, lVar4 = std::__cxx11::string::size(), uVar6 < lVar4 - 1U;
        local_a0 = local_a0 + 1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&i);
      if (*pcVar5 == '\\') {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&i);
        local_a0 = local_a0 + 1;
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&i);
        if ((*pcVar5 < '0') ||
           (pcVar5 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&i), '7' < *pcVar5)) {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&i);
          switch(*pcVar5) {
          case '(':
            it._M_current._7_1_ = '(';
            break;
          case ')':
            it._M_current._7_1_ = ')';
            break;
          default:
            it._M_current._7_1_ = '\0';
            break;
          case '\\':
            it._M_current._7_1_ = '\\';
            break;
          case 'b':
            it._M_current._7_1_ = '\b';
            break;
          case 'f':
            it._M_current._7_1_ = '\f';
            break;
          case 'n':
            it._M_current._7_1_ = '\n';
            break;
          case 'r':
            it._M_current._7_1_ = '\r';
            break;
          case 't':
            it._M_current._7_1_ = '\t';
          }
        }
        else {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&i);
          it._M_current._7_1_ = *pcVar5 + -0x30;
          uVar6 = local_a0 + 1;
          uVar7 = std::__cxx11::string::size();
          bVar1 = false;
          if (uVar6 < uVar7) {
            local_e0 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&i,1);
            pcVar5 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_e0);
            bVar1 = false;
            if ('/' < *pcVar5) {
              local_e8 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&i,1);
              pcVar5 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_e8);
              bVar1 = *pcVar5 < '8';
            }
          }
          if (bVar1) {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&i);
            local_a0 = local_a0 + 1;
            it._M_current._7_1_ = it._M_current._7_1_ << 3;
            pcVar5 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&i);
            it._M_current._7_1_ = it._M_current._7_1_ + *pcVar5 + -0x30;
            uVar6 = local_a0 + 1;
            uVar7 = std::__cxx11::string::size();
            bVar1 = false;
            if (uVar6 < uVar7) {
              local_f0 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&i,1);
              pcVar5 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_f0);
              bVar1 = false;
              if ('/' < *pcVar5) {
                local_f8 = __gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&i,1);
                pcVar5 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_f8);
                bVar1 = *pcVar5 < '8';
              }
            }
            if (bVar1) {
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&i);
              local_a0 = local_a0 + 1;
              it._M_current._7_1_ = it._M_current._7_1_ << 3;
              pcVar5 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&i);
              it._M_current._7_1_ = it._M_current._7_1_ + *pcVar5 + -0x30;
            }
          }
        }
      }
      else {
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&i);
        it._M_current._7_1_ = *pcVar5;
      }
      std::streambuf::sputn((char *)local_88,(long)((long)&it._M_current + 7));
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&i);
    }
    this_local = (PDFObjectParser *)operator_new(0x68);
    std::__cxx11::stringbuf::str();
    MaybeDecryptString(&local_118,this,&local_138);
    PDFLiteralString::PDFLiteralString((PDFLiteralString *)this_local,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  else {
    this_00 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)local_d0,(ulong)inToken);
    uVar3 = std::__cxx11::string::c_str();
    Trace::TraceToLog(this_00,
                      "PDFObjectParser::ParseLiteralString, exception in parsing literal string, no closing paranthesis, Expression: %s"
                      ,uVar3);
    std::__cxx11::string::~string(local_d0);
    this_local = (PDFObjectParser *)0x0;
  }
  local_d4 = 1;
  std::__cxx11::stringbuf::~stringbuf(local_88);
  return (PDFObject *)this_local;
}

Assistant:

PDFObject* PDFObjectParser::ParseLiteralString(const std::string& inToken)
{
  std::stringbuf stringBuffer;
	Byte buffer;
	std::string::const_iterator it = inToken.begin();
	size_t i=1;
	++it; // skip first paranthesis
	
	// verify that last character is ')'
	if(inToken.at(inToken.size()-1) != scRightParanthesis)
	{
		TRACE_LOG1("PDFObjectParser::ParseLiteralString, exception in parsing literal string, no closing paranthesis, Expression: %s",inToken.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}

	for(; i < inToken.size()-1;++it,++i)
	{
		if(*it == '\\')
		{
			++it;
			++i;
			if('0' <= *it && *it <= '7')
			{
				buffer = (*it - '0');
				if (i+1 < inToken.size() && '0' <= *(it+1) && *(it+1) <= '7'){
					++it;
					++i;
					buffer = buffer << 3;
					buffer += (*it - '0');
					if (i + 1 < inToken.size() && '0' <= *(it + 1) && *(it + 1) <= '7'){
						++it;
						++i;
						buffer = buffer << 3;
						buffer += (*it - '0');
					}
				}
			}
			else
			{
				switch(*it)
				{
					case 'n':
						buffer = '\n';
						break;
					case 'r':
						buffer = '\r';
						break;
					case 't':
						buffer = '\t';
						break;
					case 'b':
						buffer = '\b';
						break;
					case 'f':
						buffer = '\f';
						break;
					case '\\':
						buffer = '\\';
						break;
					case '(':
						buffer = '(';
						break;
					case ')':
						buffer = ')';
						break;
					default:
						// error!
						buffer = 0;
						break;
				}
			}
		}
		else
		{
			buffer = *it;
		}
		stringBuffer.sputn((const char*)&buffer,1);
	}

	return new PDFLiteralString(MaybeDecryptString(stringBuffer.str()));
}